

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O3

bool __thiscall
webrtc::TraceImpl::CreateFileName
          (TraceImpl *this,char *file_name_utf8,char *file_name_with_counter_utf8,uint32_t new_count
          )

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  sVar3 = strlen(file_name_utf8);
  uVar6 = (uint)sVar3;
  if (-1 < (int)uVar6) {
    uVar5 = -(uint)(uVar6 == 0);
    uVar4 = (ulong)(uVar6 & 0x7fffffff);
    do {
      if ((long)uVar4 < 2) goto LAB_0018e86d;
      uVar1 = uVar4 - 1;
      lVar2 = uVar4 - 1;
      uVar4 = uVar1;
    } while (file_name_utf8[lVar2] != '.');
    uVar5 = (uint)uVar1;
LAB_0018e86d:
    if (uVar5 == 0) {
      uVar5 = uVar6;
    }
    sVar3 = (size_t)(int)uVar5;
    memcpy(file_name_with_counter_utf8,file_name_utf8,sVar3);
    sprintf(file_name_with_counter_utf8 + sVar3,"_%lu%s",(ulong)new_count,file_name_utf8 + sVar3);
  }
  return -1 < (int)uVar6;
}

Assistant:

bool TraceImpl::CreateFileName(
    const char file_name_utf8[FileWrapper::kMaxFileNameSize],
    char file_name_with_counter_utf8[FileWrapper::kMaxFileNameSize],
    const uint32_t new_count) const {
  int32_t length = (int32_t)strlen(file_name_utf8);
  if (length < 0) {
    return false;
  }

  int32_t length_without_file_ending = length - 1;
  while (length_without_file_ending > 0) {
    if (file_name_utf8[length_without_file_ending] == '.') {
      break;
    } else {
      length_without_file_ending--;
    }
  }
  if (length_without_file_ending == 0) {
    length_without_file_ending = length;
  }
  memcpy(file_name_with_counter_utf8, file_name_utf8,
         length_without_file_ending);
  sprintf(file_name_with_counter_utf8 + length_without_file_ending, "_%lu%s",
          static_cast<long unsigned int>(new_count),
          file_name_utf8 + length_without_file_ending);
  return true;
}